

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isLinearMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int c;
  bool isFixedPointDepth;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int j;
  int j_00;
  int c_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 depths1;
  Vec4 depths0;
  Vec2 local_b0;
  Vec2 local_a8;
  Vec2 local_a0;
  Vec2 local_98;
  Vec2 vBounds1;
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level0->m_format);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar6 = floorf(uBounds0.m_data[0] + -0.5);
  fVar7 = floorf(uBounds0.m_data[1] + -0.5);
  fVar8 = floorf(uBounds1.m_data[0] + -0.5);
  fVar9 = floorf(uBounds1.m_data[1] + -0.5);
  fVar10 = floorf(vBounds0.m_data[0] + -0.5);
  fVar11 = floorf(vBounds0.m_data[1] + -0.5);
  fVar12 = floorf(vBounds1.m_data[0] + -0.5);
  fVar13 = floorf(vBounds1.m_data[1] + -0.5);
  iVar2 = (int)fVar10;
  while (c = iVar2, c <= (int)fVar11) {
    fVar10 = (float)c;
    c_00 = (int)fVar6;
    while (iVar2 = c + 1, c_00 <= (int)fVar7) {
      fVar14 = (float)c_00;
      fVar24 = (uBounds0.m_data[0] + -0.5) - fVar14;
      fVar25 = (uBounds0.m_data[1] + -0.5) - fVar14;
      auVar17._4_4_ = fVar25;
      auVar17._0_4_ = fVar24;
      auVar17._8_4_ = 0.0 - fVar14;
      auVar17._12_4_ = 0.0 - fVar14;
      auVar17 = minps(_DAT_007f0910,auVar17);
      fVar14 = (vBounds0.m_data[0] + -0.5) - fVar10;
      fVar26 = (vBounds0.m_data[1] + -0.5) - fVar10;
      auVar18._4_4_ = fVar26;
      auVar18._0_4_ = fVar14;
      auVar18._8_4_ = 0.0 - fVar10;
      auVar18._12_4_ = 0.0 - fVar10;
      auVar18 = minps(_DAT_007f0910,auVar18);
      Vector<float,_4>::Vector(&depths0);
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,c_00,dim);
      c_00 = c_00 + 1;
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c_00,dim);
      iVar4 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_00);
      iVar5 = TexVerifierUtil::wrap(sampler->wrapT,c + 1,dim_00);
      depths0.m_data[0] = lookupDepth(level0,sampler,iVar2,iVar4,coordZ);
      depths0.m_data[1] = lookupDepth(level0,sampler,iVar3,iVar4,coordZ);
      depths0.m_data[2] = lookupDepth(level0,sampler,iVar2,iVar5,coordZ);
      depths0.m_data[3] = lookupDepth(level0,sampler,iVar3,iVar5,coordZ);
      iVar2 = (int)fVar12;
      while (iVar3 = iVar2, iVar3 <= (int)fVar13) {
        fVar15 = (float)iVar3;
        iVar4 = (int)fVar8;
        while (iVar2 = iVar3 + 1, iVar4 <= (int)fVar9) {
          fVar16 = (float)iVar4;
          fVar21 = (uBounds1.m_data[0] + -0.5) - fVar16;
          fVar22 = (uBounds1.m_data[1] + -0.5) - fVar16;
          auVar19._4_4_ = fVar22;
          auVar19._0_4_ = fVar21;
          auVar19._8_4_ = 0.0 - fVar16;
          auVar19._12_4_ = 0.0 - fVar16;
          auVar19 = minps(_DAT_007f0910,auVar19);
          fVar16 = (vBounds1.m_data[0] + -0.5) - fVar15;
          fVar23 = (vBounds1.m_data[1] + -0.5) - fVar15;
          auVar20._4_4_ = fVar23;
          auVar20._0_4_ = fVar16;
          auVar20._8_4_ = 0.0 - fVar15;
          auVar20._12_4_ = 0.0 - fVar15;
          auVar20 = minps(_DAT_007f0910,auVar20);
          Vector<float,_4>::Vector(&depths1);
          iVar2 = TexVerifierUtil::wrap(sampler->wrapS,iVar4,dim_01);
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar4 + 1,dim_01);
          j = TexVerifierUtil::wrap(sampler->wrapT,iVar3,dim_02);
          j_00 = TexVerifierUtil::wrap(sampler->wrapT,iVar3 + 1,dim_02);
          depths1.m_data[0] = lookupDepth(level1,sampler,iVar2,j,coordZ);
          depths1.m_data[1] = lookupDepth(level1,sampler,iVar5,j,coordZ);
          depths1.m_data[2] = lookupDepth(level1,sampler,iVar2,j_00,coordZ);
          depths1.m_data[3] = lookupDepth(level1,sampler,iVar5,j_00,coordZ);
          local_98.m_data[1] = (float)(-(uint)(0.0 <= fVar25) & auVar17._4_4_);
          local_98.m_data[0] = (float)(-(uint)(0.0 <= fVar24) & auVar17._0_4_);
          local_a0.m_data[1] = (float)(-(uint)(0.0 <= fVar26) & auVar18._4_4_);
          local_a0.m_data[0] = (float)(-(uint)(0.0 <= fVar14) & auVar18._0_4_);
          local_a8.m_data[1] = (float)(-(uint)(0.0 <= fVar22) & auVar19._4_4_);
          local_a8.m_data[0] = (float)(-(uint)(0.0 <= fVar21) & auVar19._0_4_);
          local_b0.m_data[1] = (float)(-(uint)(0.0 <= fVar23) & auVar20._4_4_);
          local_b0.m_data[0] = (float)(-(uint)(0.0 <= fVar16) & auVar20._0_4_);
          bVar1 = isTrilinearCompareValid
                            (sampler->compare,prec,&depths0,&depths1,&local_98,&local_a0,&local_a8,
                             &local_b0,fBounds,cmpReference,result,isFixedPointDepth);
          iVar4 = iVar4 + 1;
          if (bVar1) goto LAB_007c7769;
        }
      }
    }
  }
LAB_007c7769:
  return c <= (int)fVar11;
}

Assistant:

static bool isLinearMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const TexComparePrecision&		prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const float						cmpReference,
													const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int	minI1				= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y()-0.5f);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
			Vec4		depths0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);

				depths0[0] = lookupDepth(level0, sampler, x0, y0, coordZ);
				depths0[1] = lookupDepth(level0, sampler, x1, y0, coordZ);
				depths0[2] = lookupDepth(level0, sampler, x0, y1, coordZ);
				depths0[3] = lookupDepth(level0, sampler, x1, y1, coordZ);
			}

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
					Vec4		depths1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);

						depths1[0] = lookupDepth(level1, sampler, x0, y0, coordZ);
						depths1[1] = lookupDepth(level1, sampler, x1, y0, coordZ);
						depths1[2] = lookupDepth(level1, sampler, x0, y1, coordZ);
						depths1[3] = lookupDepth(level1, sampler, x1, y1, coordZ);
					}

					if (isTrilinearCompareValid(sampler.compare, prec, depths0, depths1,
												Vec2(minA0, maxA0), Vec2(minB0, maxB0),
												Vec2(minA1, maxA1), Vec2(minB1, maxB1),
												fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}